

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::set_max_uploads(torrent *this,int limit,bool state_update)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = 0xffffff;
  if (0 < limit) {
    uVar3 = limit;
  }
  if (uVar3 != *(uint3 *)&this->field_0x5d4) {
    if (state_update) {
      state_updated(this);
    }
    *(short *)&this->field_0x5d4 = (short)uVar3;
    this->field_0x5d6 = (char)(uVar3 >> 0x10);
    iVar2 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if (((byte)iVar2 & state_update) == 1) {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** set-max-uploads: %d",(ulong)*(uint3 *)&this->field_0x5d4);
    }
    if ((state_update) && (bVar1 = (this->m_need_save_resume_data).m_val, (bVar1 & 0x20) == 0)) {
      (this->m_need_save_resume_data).m_val = bVar1 | 0x20;
      state_updated(this);
      return;
    }
  }
  return;
}

Assistant:

void torrent::set_max_uploads(int limit, bool const state_update)
	{
		TORRENT_ASSERT(is_single_thread());
		// TODO: perhaps 0 should actually mean 0
		if (limit <= 0) limit = (1 << 24) - 1;
		if (int(m_max_uploads) == limit) return;
		if (state_update) state_updated();
		m_max_uploads = aux::numeric_cast<std::uint32_t>(limit);
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log() && state_update)
			debug_log("*** set-max-uploads: %d", m_max_uploads);
#endif

		if (state_update)
			set_need_save_resume(torrent_handle::if_config_changed);
	}